

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void __thiscall MasterObjectHolder::~MasterObjectHolder(MasterObjectHolder *this)

{
  bool bVar1;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar1 = ZmqContextManager::setContextToLeakOnDelete(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    ZmqContextManager::closeContext(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  deleteAll(this);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->errorStrings).m_obj);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->tripDetect).lineDetector.
              super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
  ::~deque(&(this->apps).m_obj);
  std::
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  ::~deque(&(this->feds).m_obj);
  std::
  deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
  ::~deque(&(this->cores).m_obj);
  std::
  deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
  ::~deque((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
            *)this);
  return;
}

Assistant:

MasterObjectHolder::~MasterObjectHolder()
{
#ifdef HELICS_ENABLE_ZMQ_CORE
    if (ZmqContextManager::setContextToLeakOnDelete()) {
        ZmqContextManager::closeContext();  // LCOV_EXCL_LINE
    }
#endif
    deleteAll();
    // std::cout << "end of master Object Holder destructor" << std::endl;
}